

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> * __thiscall
Test::Suite::listTests
          (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
           *__return_storage_ptr__,Suite *this)

{
  bool bVar1;
  size_type __n;
  element_type *peVar2;
  iterator iVar3;
  move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>_>
  __last;
  __normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
  local_100;
  const_iterator local_f8;
  undefined1 local_f0 [8];
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> tmp;
  shared_ptr<Test::Suite> *suite;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  TestMethodInfo local_78;
  reference local_50;
  TestMethod *method;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_> *__range1;
  Suite *this_local;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *result;
  
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::size
                  (&this->testMethods);
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::begin
                     (&this->testMethods);
  method = (TestMethod *)
           std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::end
                     (&this->testMethods);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Test::Suite::TestMethod_*,_std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>_>
                                     *)&method), bVar1) {
    local_78.reference =
         (uintptr_t)
         __gnu_cxx::
         __normal_iterator<const_Test::Suite::TestMethod_*,_std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>_>
         ::operator*(&__end1);
    local_50 = (reference)local_78.reference;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_78.reference,"(");
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                   &local_50->argString);
    std::operator+(&local_78.fullName,&local_98,")");
    std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::
    emplace_back<Test::TestMethodInfo>(__return_storage_ptr__,&local_78);
    TestMethodInfo::~TestMethodInfo(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_Test::Suite::TestMethod_*,_std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>::
             begin(&this->subSuites);
  suite = (shared_ptr<Test::Suite> *)
          std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
          ::end(&this->subSuites);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
                             *)&suite), bVar1) {
    tmp.super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
                  ::operator*(&__end1_1);
    peVar2 = std::__shared_ptr_access<Test::Suite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Test::Suite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tmp.
                           super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*peVar2->_vptr_Suite[4])(local_f0);
    local_100._M_current =
         (TestMethodInfo *)
         std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::end
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<Test::TestMethodInfo_const*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>
    ::__normal_iterator<Test::TestMethodInfo*>
              ((__normal_iterator<Test::TestMethodInfo_const*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>
                *)&local_f8,&local_100);
    iVar3 = std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::begin
                      ((vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)
                       local_f0);
    __first = std::
              make_move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>>
                        ((__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
                          )iVar3._M_current);
    iVar3 = std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::end
                      ((vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)
                       local_f0);
    __last = std::
             make_move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>>
                       ((__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
                         )iVar3._M_current);
    std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>>,void>
              ((vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>> *)
               __return_storage_ptr__,local_f8,__first,__last);
    std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::~vector
              ((vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)local_f0);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestMethodInfo> Suite::listTests() const {
  std::vector<TestMethodInfo> result;
  result.reserve(testMethods.size());
  for (const auto &method : testMethods) {
    result.emplace_back(
        TestMethodInfo{reinterpret_cast<std::uintptr_t>(&method), method.name + "(" + method.argString + ")"});
  }
  for (const auto &suite : subSuites) {
    auto tmp = suite->listTests();
    result.insert(result.end(), std::make_move_iterator(tmp.begin()), std::make_move_iterator(tmp.end()));
  }
  return result;
}